

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int accept_connection(int socket_descriptor,int busy_waiting)

{
  int socket_fd;
  int iVar1;
  socklen_t length;
  sockaddr_un client;
  socklen_t local_8c;
  sockaddr local_86 [6];
  
  local_8c = 0x6e;
  socket_fd = accept(socket_descriptor,local_86,&local_8c);
  if (socket_fd == -1) {
    throw("Error accepting connection");
  }
  set_socket_both_buffer_sizes(socket_fd);
  if (busy_waiting != 0) {
    iVar1 = set_io_flag(socket_fd,0x800);
    if (iVar1 == -1) {
      throw("Error setting socket to non-blocking on server-side");
    }
  }
  close(socket_descriptor);
  return socket_fd;
}

Assistant:

int accept_connection(int socket_descriptor, int busy_waiting) {
	struct sockaddr_un client;
	int connection;
	socklen_t length = sizeof client;

	// Start accepting connections on this socket and
	// receive a connection-specific socket for any
	// incoming socket
	// clang-format off
	connection = accept(
		socket_descriptor,
		(struct sockaddr*)&client,
		&length
	);
	// clang-format on

	if (connection == -1) {
		throw("Error accepting connection");
	}

	set_socket_both_buffer_sizes(connection);

	if (busy_waiting) {
		// adjust_socket_blocking_timeout(connection, 0, 1);
		if (set_io_flag(connection, O_NONBLOCK) == -1) {
			throw("Error setting socket to non-blocking on server-side");
		}
	}

	// Don't need this one anymore (because we only have one connection)
	close(socket_descriptor);

	return connection;
}